

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O1

bool __thiscall
iDynTree::KinDynComputations::getCenterOfMassVelocity
          (KinDynComputations *this,Span<double,__1L> vel)

{
  long lVar1;
  pointer __dest;
  Index size;
  long lVar2;
  long lVar3;
  ulong uVar4;
  Vector3 VStack_48;
  
  __dest = vel.storage_.data_;
  if (vel.storage_.super_extent_type<_1L>.size_.size_ == 3) {
    getCenterOfMassVelocity(&VStack_48,this);
    uVar4 = 3;
    if ((((undefined1  [16])vel.storage_ & (undefined1  [16])0x7) == (undefined1  [16])0x0) &&
       (uVar4 = (ulong)((uint)((ulong)__dest >> 3) & 1), 2 < uVar4)) {
      uVar4 = 3;
    }
    lVar2 = 3 - uVar4;
    if (uVar4 != 0) {
      memcpy(__dest,&VStack_48,uVar4 * 8);
    }
    lVar3 = (lVar2 - (lVar2 >> 0x3f) & 0xfffffffffffffffeU) + uVar4;
    if (1 < lVar2) {
      lVar1 = uVar4 + 2;
      if ((long)(uVar4 + 2) < lVar3) {
        lVar1 = lVar3;
      }
      memcpy(__dest + uVar4,VStack_48.m_data + uVar4,
             (~uVar4 + lVar1 & 0xfffffffffffffffe) * 8 + 0x10);
    }
    if (lVar3 < 3) {
      memcpy(__dest + (lVar2 / 2) * 2 + uVar4,VStack_48.m_data + (lVar2 / 2) * 2 + uVar4,
             (3 - lVar3) * 8);
    }
  }
  else {
    iDynTree::reportError("KinDynComputations","getCenterOfMassVelocity","Wrong size in input vel");
  }
  return vel.storage_.super_extent_type<_1L>.size_.size_ == 3;
}

Assistant:

bool KinDynComputations::getCenterOfMassVelocity(Span<double> vel)
{
    constexpr int expected_velocity_size = 3;
    bool ok = vel.size() == expected_velocity_size;
    if( !ok )
    {
        reportError("KinDynComputations","getCenterOfMassVelocity","Wrong size in input vel");
        return false;
    }

    toEigen(vel) = toEigen(getCenterOfMassVelocity());

    return true;
}